

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_ghost_int(REF_NODE ref_node,REF_INT *vector,REF_INT ldim)

{
  int iVar1;
  uint uVar2;
  REF_GLOB local_b0;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT local;
  REF_INT i;
  REF_INT *b_vector;
  REF_INT *a_vector;
  REF_INT *a_next;
  REF_INT node;
  REF_INT part;
  REF_GLOB *b_global;
  REF_GLOB *a_global;
  REF_INT b_total;
  REF_INT a_total;
  REF_INT *b_size;
  REF_INT *a_size;
  REF_MPI ref_mpi;
  REF_INT *pRStack_20;
  REF_INT ldim_local;
  REF_INT *vector_local;
  REF_NODE ref_node_local;
  
  a_size = &ref_node->ref_mpi->n;
  if (((REF_MPI)a_size)->n < 2) {
    ref_node_local._4_4_ = 0;
  }
  else {
    ref_mpi._4_4_ = ldim;
    pRStack_20 = vector;
    vector_local = &ref_node->n;
    if (((REF_MPI)a_size)->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x398,
             "ref_node_ghost_int","malloc a_size of REF_INT negative");
      ref_node_local._4_4_ = 1;
    }
    else {
      b_size = (REF_INT *)malloc((long)((REF_MPI)a_size)->n << 2);
      if (b_size == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x398,"ref_node_ghost_int","malloc a_size of REF_INT NULL");
        ref_node_local._4_4_ = 2;
      }
      else {
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < *a_size;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          b_size[ref_private_macro_code_rss] = 0;
        }
        if (*a_size < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x399,"ref_node_ghost_int","malloc b_size of REF_INT negative");
          ref_node_local._4_4_ = 1;
        }
        else {
          _b_total = (REF_INT *)malloc((long)*a_size << 2);
          if (_b_total == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x399,"ref_node_ghost_int","malloc b_size of REF_INT NULL");
            ref_node_local._4_4_ = 2;
          }
          else {
            for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < *a_size;
                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              _b_total[ref_private_macro_code_rss_1] = 0;
            }
            for (a_next._0_4_ = 0; (int)a_next < vector_local[1]; a_next._0_4_ = (int)a_next + 1) {
              if ((((-1 < (int)a_next) && ((int)a_next < vector_local[1])) &&
                  (-1 < *(long *)(*(long *)(vector_local + 4) + (long)(int)a_next * 8))) &&
                 (*(int *)(*(long *)(vector_local + 0x14) + 4) !=
                  *(int *)(*(long *)(vector_local + 10) + (long)(int)a_next * 4))) {
                iVar1 = *(int *)(*(long *)(vector_local + 10) + (long)(int)a_next * 4);
                b_size[iVar1] = b_size[iVar1] + 1;
              }
            }
            uVar2 = ref_mpi_alltoall((REF_MPI)a_size,b_size,_b_total,1);
            if (uVar2 == 0) {
              a_global._4_4_ = 0;
              for (a_next._4_4_ = 0; a_next._4_4_ < *a_size; a_next._4_4_ = a_next._4_4_ + 1) {
                a_global._4_4_ = b_size[a_next._4_4_] + a_global._4_4_;
              }
              if (a_global._4_4_ < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x3a6,"ref_node_ghost_int","malloc a_global of REF_GLOB negative");
                ref_node_local._4_4_ = 1;
              }
              else {
                b_global = (REF_GLOB *)malloc((long)a_global._4_4_ << 3);
                if (b_global == (REF_GLOB *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x3a6,"ref_node_ghost_int","malloc a_global of REF_GLOB NULL");
                  ref_node_local._4_4_ = 2;
                }
                else {
                  a_global._0_4_ = 0;
                  for (a_next._4_4_ = 0; a_next._4_4_ < *a_size; a_next._4_4_ = a_next._4_4_ + 1) {
                    a_global._0_4_ = _b_total[a_next._4_4_] + (int)a_global;
                  }
                  if ((int)a_global < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0x3aa,"ref_node_ghost_int","malloc b_global of REF_GLOB negative");
                    ref_node_local._4_4_ = 1;
                  }
                  else {
                    _node = malloc((long)(int)a_global << 3);
                    if (_node == (void *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                             ,0x3aa,"ref_node_ghost_int","malloc b_global of REF_GLOB NULL");
                      ref_node_local._4_4_ = 2;
                    }
                    else if (*a_size < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                             ,0x3ac,"ref_node_ghost_int","malloc a_next of REF_INT negative");
                      ref_node_local._4_4_ = 1;
                    }
                    else {
                      a_vector = (REF_INT *)malloc((long)*a_size << 2);
                      if (a_vector == (REF_INT *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                               ,0x3ac,"ref_node_ghost_int","malloc a_next of REF_INT NULL");
                        ref_node_local._4_4_ = 2;
                      }
                      else {
                        *a_vector = 0;
                        for (a_next._4_4_ = 1; a_next._4_4_ < *a_size;
                            a_next._4_4_ = a_next._4_4_ + 1) {
                          a_vector[a_next._4_4_] =
                               a_vector[a_next._4_4_ + -1] + b_size[a_next._4_4_ + -1];
                        }
                        for (a_next._0_4_ = 0; (int)a_next < vector_local[1];
                            a_next._0_4_ = (int)a_next + 1) {
                          if (((-1 < (int)a_next) && ((int)a_next < vector_local[1])) &&
                             ((-1 < *(long *)(*(long *)(vector_local + 4) + (long)(int)a_next * 8)
                              && (*(int *)(*(long *)(vector_local + 0x14) + 4) !=
                                  *(int *)(*(long *)(vector_local + 10) + (long)(int)a_next * 4)))))
                          {
                            a_next._4_4_ = *(int *)(*(long *)(vector_local + 10) +
                                                   (long)(int)a_next * 4);
                            if ((((int)a_next < 0) || (vector_local[1] <= (int)a_next)) ||
                               (*(long *)(*(long *)(vector_local + 4) + (long)(int)a_next * 8) < 0))
                            {
                              local_b0 = -1;
                            }
                            else {
                              local_b0 = *(REF_GLOB *)
                                          (*(long *)(vector_local + 4) + (long)(int)a_next * 8);
                            }
                            b_global[a_vector[a_next._4_4_]] = local_b0;
                            iVar1 = *(int *)(*(long *)(vector_local + 10) + (long)(int)a_next * 4);
                            a_vector[iVar1] = a_vector[iVar1] + 1;
                          }
                        }
                        uVar2 = ref_mpi_alltoallv((REF_MPI)a_size,b_global,b_size,_node,_b_total,1,2
                                                 );
                        if (uVar2 == 0) {
                          if ((a_global._4_4_ < (int)(0x7fffffff / (long)ref_mpi._4_4_)) &&
                             ((int)a_global < (int)(0x7fffffff / (long)ref_mpi._4_4_))) {
                            if (ref_mpi._4_4_ * a_global._4_4_ < 0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                     ,0x3bf,"ref_node_ghost_int",
                                     "malloc a_vector of REF_INT negative");
                              return 1;
                            }
                            b_vector = (REF_INT *)
                                       malloc((long)(ref_mpi._4_4_ * a_global._4_4_) << 2);
                            if (b_vector == (REF_INT *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                     ,0x3bf,"ref_node_ghost_int","malloc a_vector of REF_INT NULL");
                              return 2;
                            }
                            if (ref_mpi._4_4_ * (int)a_global < 0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                     ,0x3c0,"ref_node_ghost_int",
                                     "malloc b_vector of REF_INT negative");
                              return 1;
                            }
                            _local = malloc((long)(ref_mpi._4_4_ * (int)a_global) << 2);
                            if (_local == (void *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                     ,0x3c0,"ref_node_ghost_int","malloc b_vector of REF_INT NULL");
                              return 2;
                            }
                            for (a_next._0_4_ = 0; (int)a_next < (int)a_global;
                                a_next._0_4_ = (int)a_next + 1) {
                              uVar2 = ::ref_node_local((REF_NODE)vector_local,
                                                       *(REF_GLOB *)
                                                        ((long)_node + (long)(int)a_next * 8),
                                                       &ref_malloc_init_i_1);
                              if (uVar2 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                       ,0x3c2,"ref_node_ghost_int",(ulong)uVar2,"g2l");
                                return uVar2;
                              }
                              for (ref_malloc_init_i = 0; ref_malloc_init_i < ref_mpi._4_4_;
                                  ref_malloc_init_i = ref_malloc_init_i + 1) {
                                *(REF_INT *)
                                 ((long)_local +
                                 (long)(ref_malloc_init_i + ref_mpi._4_4_ * (int)a_next) * 4) =
                                     pRStack_20
                                     [ref_malloc_init_i + ref_mpi._4_4_ * ref_malloc_init_i_1];
                              }
                            }
                            uVar2 = ref_mpi_alltoallv((REF_MPI)a_size,_local,_b_total,b_vector,
                                                      b_size,ref_mpi._4_4_,1);
                            if (uVar2 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                     ,0x3c9,"ref_node_ghost_int",(ulong)uVar2,"alltoallv vector");
                              return uVar2;
                            }
                            for (a_next._0_4_ = 0; (int)a_next < a_global._4_4_;
                                a_next._0_4_ = (int)a_next + 1) {
                              uVar2 = ::ref_node_local((REF_NODE)vector_local,b_global[(int)a_next],
                                                       &ref_malloc_init_i_1);
                              if (uVar2 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                       ,0x3cc,"ref_node_ghost_int",(ulong)uVar2,"g2l");
                                return uVar2;
                              }
                              for (ref_malloc_init_i = 0; ref_malloc_init_i < ref_mpi._4_4_;
                                  ref_malloc_init_i = ref_malloc_init_i + 1) {
                                pRStack_20[ref_malloc_init_i + ref_mpi._4_4_ * ref_malloc_init_i_1]
                                     = b_vector[ref_malloc_init_i + ref_mpi._4_4_ * (int)a_next];
                              }
                            }
                            free(_local);
                            free(b_vector);
                          }
                          else {
                            if (a_global._4_4_ < 0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                     ,0x3d3,"ref_node_ghost_int",
                                     "malloc a_vector of REF_INT negative");
                              return 1;
                            }
                            b_vector = (REF_INT *)malloc((long)a_global._4_4_ << 2);
                            if (b_vector == (REF_INT *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                     ,0x3d3,"ref_node_ghost_int","malloc a_vector of REF_INT NULL");
                              return 2;
                            }
                            if ((int)a_global < 0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                     ,0x3d4,"ref_node_ghost_int",
                                     "malloc b_vector of REF_INT negative");
                              return 1;
                            }
                            _local = malloc((long)(int)a_global << 2);
                            if (_local == (void *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                     ,0x3d4,"ref_node_ghost_int","malloc b_vector of REF_INT NULL");
                              return 2;
                            }
                            for (ref_malloc_init_i = 0; ref_malloc_init_i < ref_mpi._4_4_;
                                ref_malloc_init_i = ref_malloc_init_i + 1) {
                              for (a_next._0_4_ = 0; (int)a_next < (int)a_global;
                                  a_next._0_4_ = (int)a_next + 1) {
                                uVar2 = ::ref_node_local((REF_NODE)vector_local,
                                                         *(REF_GLOB *)
                                                          ((long)_node + (long)(int)a_next * 8),
                                                         &ref_malloc_init_i_1);
                                if (uVar2 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                         ,0x3d7,"ref_node_ghost_int",(ulong)uVar2,"g2l");
                                  return uVar2;
                                }
                                *(REF_INT *)((long)_local + (long)(int)a_next * 4) =
                                     pRStack_20
                                     [ref_malloc_init_i + ref_mpi._4_4_ * ref_malloc_init_i_1];
                              }
                              uVar2 = ref_mpi_alltoallv((REF_MPI)a_size,_local,_b_total,b_vector,
                                                        b_size,1,1);
                              if (uVar2 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                       ,0x3dd,"ref_node_ghost_int",(ulong)uVar2,"alltoallv vector");
                                return uVar2;
                              }
                              for (a_next._0_4_ = 0; (int)a_next < a_global._4_4_;
                                  a_next._0_4_ = (int)a_next + 1) {
                                uVar2 = ::ref_node_local((REF_NODE)vector_local,
                                                         b_global[(int)a_next],&ref_malloc_init_i_1)
                                ;
                                if (uVar2 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                         ,0x3e0,"ref_node_ghost_int",(ulong)uVar2,"g2l");
                                  return uVar2;
                                }
                                pRStack_20[ref_malloc_init_i + ref_mpi._4_4_ * ref_malloc_init_i_1]
                                     = b_vector[(int)a_next];
                              }
                            }
                            free(_local);
                            free(b_vector);
                          }
                          free(a_vector);
                          free(_node);
                          free(b_global);
                          free(_b_total);
                          free(b_size);
                          ref_node_local._4_4_ = 0;
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                 ,0x3bc,"ref_node_ghost_int",(ulong)uVar2,"alltoallv global");
                          ref_node_local._4_4_ = uVar2;
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x3a2,"ref_node_ghost_int",(ulong)uVar2,"alltoall sizes");
              ref_node_local._4_4_ = uVar2;
            }
          }
        }
      }
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_ghost_int(REF_NODE ref_node, REF_INT *vector,
                                      REF_INT ldim) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_GLOB *a_global, *b_global;
  REF_INT part, node;
  REF_INT *a_next;
  REF_INT *a_vector, *b_vector;
  REF_INT i, local;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      a_size[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) { a_total += a_size[part]; }
  ref_malloc(a_global, a_total, REF_GLOB);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) { b_total += b_size[part]; }
  ref_malloc(b_global, b_total, REF_GLOB);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_size, b_global, b_size, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");

  if (a_total < REF_INT_MAX / ldim && b_total < REF_INT_MAX / ldim) {
    ref_malloc(a_vector, ldim * a_total, REF_INT);
    ref_malloc(b_vector, ldim * b_total, REF_INT);
    for (node = 0; node < b_total; node++) {
      RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
      for (i = 0; i < ldim; i++)
        b_vector[i + ldim * node] = vector[i + ldim * local];
    }

    RSS(ref_mpi_alltoallv(ref_mpi, b_vector, b_size, a_vector, a_size, ldim,
                          REF_INT_TYPE),
        "alltoallv vector");

    for (node = 0; node < a_total; node++) {
      RSS(ref_node_local(ref_node, a_global[node], &local), "g2l");
      for (i = 0; i < ldim; i++)
        vector[i + ldim * local] = a_vector[i + ldim * node];
    }
    free(b_vector);
    free(a_vector);
  } else {
    ref_malloc(a_vector, a_total, REF_INT);
    ref_malloc(b_vector, b_total, REF_INT);
    for (i = 0; i < ldim; i++) {
      for (node = 0; node < b_total; node++) {
        RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
        b_vector[node] = vector[i + ldim * local];
      }

      RSS(ref_mpi_alltoallv(ref_mpi, b_vector, b_size, a_vector, a_size, 1,
                            REF_INT_TYPE),
          "alltoallv vector");

      for (node = 0; node < a_total; node++) {
        RSS(ref_node_local(ref_node, a_global[node], &local), "g2l");
        vector[i + ldim * local] = a_vector[node];
      }
    }
    free(b_vector);
    free(a_vector);
  }

  free(a_next);
  free(b_global);
  free(a_global);
  free(b_size);
  free(a_size);

  return REF_SUCCESS;
}